

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lifecycle_hooks.cpp
# Opt level: O1

void __thiscall
TestClientContextState::TransactionRollback
          (TestClientContextState *this,undefined8 param_2,undefined8 param_3,char *param_4)

{
  char *local_18;
  
  if (param_4 != (char *)0x0) {
    local_18 = param_4;
    duckdb::optional_ptr<duckdb::ErrorData,_true>::CheckValid
              ((optional_ptr<duckdb::ErrorData,_true> *)&local_18);
    if (*local_18 == '\x01') {
      duckdb::optional_ptr<duckdb::ErrorData,_true>::CheckValid
                ((optional_ptr<duckdb::ErrorData,_true> *)&local_18);
      Catch::clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&this->transaction_errors,(value_type *)(local_18 + 0x28));
    }
  }
  return;
}

Assistant:

void TransactionRollback(MetaTransaction &transaction, ClientContext &context,
	                         optional_ptr<ErrorData> error) override {
		if (error && error->HasError()) {
			transaction_errors.push_back(error->Message());
		}
	}